

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_insert.cpp
# Opt level: O2

bool duckdb::PhysicalPlanGenerator::PreserveInsertionOrder
               (ClientContext *context,PhysicalOperator *plan)

{
  OrderPreservationType OVar1;
  undefined1 uVar2;
  DBConfig *pDVar3;
  
  pDVar3 = DBConfig::GetConfig(context);
  OVar1 = OrderPreservationRecursive(plan);
  if (OVar1 == FIXED_ORDER) {
    uVar2 = 1;
  }
  else if (OVar1 == NO_ORDER) {
    uVar2 = 0;
  }
  else {
    uVar2 = (pDVar3->options).preserve_insertion_order;
  }
  return (bool)uVar2;
}

Assistant:

bool PhysicalPlanGenerator::PreserveInsertionOrder(ClientContext &context, PhysicalOperator &plan) {
	auto &config = DBConfig::GetConfig(context);

	auto preservation_type = OrderPreservationRecursive(plan);
	if (preservation_type == OrderPreservationType::FIXED_ORDER) {
		// always need to maintain preservation order
		return true;
	}
	if (preservation_type == OrderPreservationType::NO_ORDER) {
		// never need to preserve order
		return false;
	}
	// preserve insertion order - check flags
	if (!config.options.preserve_insertion_order) {
		// preserving insertion order is disabled by config
		return false;
	}
	return true;
}